

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

optional<metaf::TrendGroup> *
metaf::TrendGroup::fromTrendTime(optional<metaf::TrendGroup> *__return_storage_ptr__,string *s)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  optional<metaf::MetafTime> time;
  undefined2 local_a0;
  undefined1 uStack_9e;
  undefined5 uStack_9d;
  undefined3 uStack_98;
  undefined4 uStack_95;
  undefined4 uStack_91;
  undefined2 local_8c;
  undefined1 uStack_8a;
  undefined5 uStack_89;
  undefined3 uStack_84;
  undefined4 uStack_81;
  undefined4 uStack_7d;
  string_type local_78;
  smatch match;
  uint uStack_2c;
  
  if (fromTrendTime(std::__cxx11::string_const&)::rgx_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&fromTrendTime(std::__cxx11::string_const&)::rgx_abi_cxx11_);
    if (iVar3 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&fromTrendTime(std::__cxx11::string_const&)::rgx_abi_cxx11_,
                 "([FTA][MLT])(\\d\\d\\d\\d)",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &fromTrendTime(std::__cxx11::string_const&)::rgx_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&fromTrendTime(std::__cxx11::string_const&)::rgx_abi_cxx11_);
    }
  }
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  match._M_begin._M_current = (char *)0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar2 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (s,&match,&fromTrendTime(std::__cxx11::string_const&)::rgx_abi_cxx11_,0);
  if (bVar2) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_78,&match,2);
    MetafTime::fromStringDDHHMM(&time,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    if (time.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::MetafTime>._M_engaged != false) {
      uStack_2c = uStack_2c & 0xffffff00;
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&local_78,&match,1);
      bVar2 = std::operator==(&local_78,"FM");
      std::__cxx11::string::~string((string *)&local_78);
      if (bVar2) {
        (__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::TrendGroup>._M_payload._M_value.t = FROM;
        *(ulong *)((long)&(__return_storage_ptr__->
                          super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
                          super__Optional_payload_base<metaf::TrendGroup>._M_payload + 4) =
             (ulong)uStack_2c << 0x20;
        ((optional<unsigned_int> *)
        ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0xc))->
        super__Optional_base<unsigned_int,_true,_true> =
             (_Optional_base<unsigned_int,_true,_true>)
             time.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
             super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x14) =
             time.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::MetafTime>._M_payload._8_8_;
        *(bool *)((long)&(__return_storage_ptr__->
                         super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
                         super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1c) =
             time.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::MetafTime>._M_engaged;
        *(undefined2 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1d) =
             time.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::MetafTime>._17_2_;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1f) =
             time.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::MetafTime>._19_1_;
        *(ulong *)((long)&(__return_storage_ptr__->
                          super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
                          super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x20) =
             CONCAT35(uStack_84,uStack_89);
        *(undefined4 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x28) =
             uStack_81;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x2c) =
             (undefined1)uStack_7d;
        *(undefined4 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x2c) =
             uStack_7d;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x30) = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x44) = 0;
      }
      else {
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::str(&local_78,&match,1);
        bVar2 = std::operator==(&local_78,"TL");
        std::__cxx11::string::~string((string *)&local_78);
        if (bVar2) {
          uStack_89 = time.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
                      super__Optional_payload_base<metaf::MetafTime>._M_payload._0_5_;
          uStack_84 = time.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
                      super__Optional_payload_base<metaf::MetafTime>._M_payload._5_3_;
          uStack_81 = (undefined4)
                      time.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
                      super__Optional_payload_base<metaf::MetafTime>._M_payload._8_8_;
          uStack_7d = (undefined4)
                      ((ulong)time.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
                              super__Optional_payload_base<metaf::MetafTime>._M_payload._8_8_ >>
                      0x20);
          uVar1 = uStack_7d;
          *(undefined8 *)
           &(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload
            .super__Optional_payload_base<metaf::TrendGroup>._M_payload = 5;
          (__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::TrendGroup>._M_payload._M_value.isTafTimeSpanGroup =
               false;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1c) = 0
          ;
          uStack_7d._0_1_ =
               (undefined1)
               ((ulong)time.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
                       super__Optional_payload_base<metaf::MetafTime>._M_payload._8_8_ >> 0x20);
          *(ulong *)((long)&(__return_storage_ptr__->
                            super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
                            super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1d) =
               CONCAT53(uStack_89,CONCAT12(uStack_8a,local_8c));
          *(ulong *)((long)&(__return_storage_ptr__->
                            super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
                            super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x25) =
               CONCAT17((undefined1)uStack_7d,CONCAT43(uStack_81,uStack_84));
          *(undefined4 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x2c) =
               uVar1;
          *(bool *)((long)&(__return_storage_ptr__->
                           super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
                           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x30) =
               time.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::MetafTime>._M_engaged;
          *(undefined2 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x31) =
               time.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::MetafTime>._17_2_;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x33) =
               time.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::MetafTime>._19_1_;
          *(ulong *)((long)&(__return_storage_ptr__->
                            super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
                            super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x34) =
               CONCAT35(uStack_98,uStack_9d);
          *(undefined4 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x3c) =
               uStack_95;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x40) =
               (undefined1)uStack_91;
          *(undefined4 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x40) =
               uStack_91;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x44) = 0
          ;
        }
        else {
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::str(&local_78,&match,1);
          bVar2 = std::operator==(&local_78,"AT");
          std::__cxx11::string::~string((string *)&local_78);
          if (!bVar2) goto LAB_00188803;
          uStack_9d = time.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
                      super__Optional_payload_base<metaf::MetafTime>._M_payload._0_5_;
          uStack_98 = time.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
                      super__Optional_payload_base<metaf::MetafTime>._M_payload._5_3_;
          uStack_95 = (undefined4)
                      time.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
                      super__Optional_payload_base<metaf::MetafTime>._M_payload._8_8_;
          uStack_91 = (undefined4)
                      ((ulong)time.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
                              super__Optional_payload_base<metaf::MetafTime>._M_payload._8_8_ >>
                      0x20);
          uVar1 = uStack_91;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x47) =
               time.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::MetafTime>._19_1_;
          *(undefined2 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x45) =
               time.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::MetafTime>._17_2_;
          *(undefined8 *)
           &(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload
            .super__Optional_payload_base<metaf::TrendGroup>._M_payload = 6;
          (__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::TrendGroup>._M_payload._M_value.isTafTimeSpanGroup =
               false;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1c) = 0
          ;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x30) = 0
          ;
          uStack_91._0_1_ =
               (undefined1)
               ((ulong)time.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
                       super__Optional_payload_base<metaf::MetafTime>._M_payload._8_8_ >> 0x20);
          *(ulong *)((long)&(__return_storage_ptr__->
                            super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
                            super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x31) =
               CONCAT53(uStack_9d,CONCAT12(uStack_9e,local_a0));
          *(ulong *)((long)&(__return_storage_ptr__->
                            super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
                            super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x39) =
               CONCAT17((undefined1)uStack_91,CONCAT43(uStack_95,uStack_98));
          *(undefined4 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x40) =
               uVar1;
          *(bool *)((long)&(__return_storage_ptr__->
                           super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
                           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x44) =
               time.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::MetafTime>._M_engaged;
        }
      }
      (__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::TrendGroup>._M_engaged = true;
      goto LAB_00188819;
    }
  }
LAB_00188803:
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x3c) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x44) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x30) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x38) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x20) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x28) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x10) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x18) = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::TrendGroup>._M_payload = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 8) = 0;
LAB_00188819:
  std::
  _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&match);
  return __return_storage_ptr__;
}

Assistant:

std::optional<TrendGroup> TrendGroup::fromTrendTime(const std::string & s) {
	static const std::optional<TrendGroup> notRecognised;
	static const std::regex rgx("([FTA][MLT])(\\d\\d\\d\\d)");
	static const auto matchType = 1, matchTime = 2;
	std::smatch match;
	if (!regex_match(s, match, rgx)) return notRecognised;
	const auto time = MetafTime::fromStringDDHHMM(match.str(matchTime));
	if (!time.has_value()) return notRecognised;
	TrendGroup result;
	if (match.str(matchType) == "FM") {
		result.t = Type::FROM;
		result.tFrom = time;
		return result;
	}
	if (match.str(matchType) == "TL") {
		result.t = Type::UNTIL;
		result.tTill = time;
		return result;
	}
	if (match.str(matchType) == "AT") {
		result.t = Type::AT;
		result.tAt = time;
		return result;
	}
	return notRecognised;
}